

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall Assimp::ColladaLoader::StoreSceneMaterials(ColladaLoader *this,aiScene *pScene)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  aiMaterial **ppaVar5;
  reference pvVar6;
  uint local_1c;
  uint i;
  aiScene *pScene_local;
  ColladaLoader *this_local;
  
  sVar3 = std::
          vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
          ::size(&this->newMats);
  pScene->mNumMaterials = (uint)sVar3;
  bVar2 = std::
          vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
          ::empty(&this->newMats);
  if (!bVar2) {
    sVar3 = std::
            vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
            ::size(&this->newMats);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiMaterial **)operator_new__(uVar4);
    pScene->mMaterials = ppaVar5;
    for (local_1c = 0;
        sVar3 = std::
                vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
                ::size(&this->newMats), local_1c < sVar3; local_1c = local_1c + 1) {
      pvVar6 = std::
               vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
               ::operator[](&this->newMats,(ulong)local_1c);
      pScene->mMaterials[local_1c] = pvVar6->second;
    }
    std::
    vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
    ::clear(&this->newMats);
  }
  return;
}

Assistant:

void ColladaLoader::StoreSceneMaterials( aiScene* pScene) {
    pScene->mNumMaterials = static_cast<unsigned int>(newMats.size());
    if (newMats.empty() ) {
        return;
    }
    pScene->mMaterials = new aiMaterial*[newMats.size()];
    for (unsigned int i = 0; i < newMats.size();++i) {
        pScene->mMaterials[i] = newMats[i].second;
    }
    newMats.clear();
}